

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

time_t __thiscall ON_XMLVariant::AsTime(ON_XMLVariant *this)

{
  Types TVar1;
  ON_XMLVariant *this_local;
  
  TVar1 = this->_private->_type;
  if (TVar1 == String) {
    this_local = (ON_XMLVariant *)TimeFromString(&this->_private->_string_val);
  }
  else if (TVar1 == Time) {
    this_local = (ON_XMLVariant *)(this->_private->field_2)._double_val;
  }
  else {
    this_local = (ON_XMLVariant *)0x0;
  }
  return (time_t)this_local;
}

Assistant:

time_t ON_XMLVariant::AsTime(void) const
{
  switch (_private->_type)
  {
  case Types::String:
    return TimeFromString(_private->_string_val);

  case Types::Time:
    return _private->_time_val;
          
  default: return 0;
  }
}